

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalScheduling.cpp
# Opt level: O1

void __thiscall IntervalScheduler::computeSchedule(IntervalScheduler *this)

{
  size_t sVar1;
  pointer puVar2;
  pointer pdVar3;
  double *pdVar4;
  size_t sVar5;
  double dVar6;
  
  sVar1 = this->n;
  if (sVar1 - 1 < 0xfffffffffffffffe) {
    puVar2 = (this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->bestGeneScore).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = &(this->ivals).super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>.
              _M_impl.super__Vector_impl_data._M_start[1].score;
    sVar5 = 0;
    do {
      dVar6 = pdVar3[sVar5];
      if (pdVar3[sVar5] <= *pdVar4 + pdVar3[puVar2[sVar5 + 1]]) {
        dVar6 = *pdVar4 + pdVar3[puVar2[sVar5 + 1]];
      }
      pdVar3[sVar5 + 1] = dVar6;
      sVar5 = sVar5 + 1;
      pdVar4 = pdVar4 + 2;
    } while (sVar1 != sVar5);
  }
  return;
}

Assistant:

void IntervalScheduler::computeSchedule() {

    for (size_t j = 1; j < n+1; j++) {
        double scoreIfChosen = ivals[j].score + bestGeneScore[p[j]];
        double scoreIfIgnored = bestGeneScore[j-1];

        bestGeneScore[j] = max(scoreIfChosen, scoreIfIgnored);
    } 
}